

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

NodeRefPtr<4> __thiscall
embree::sse2::GeneralBVHBuilder::
BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                        *current,CachedAllocator alloc)

{
  extended_range<unsigned_long> *range;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  ThreadLocal2 *this_00;
  iterator __position;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  unsigned_long uVar10;
  size_t i;
  long lVar11;
  Vec3fa *pVVar12;
  NodeRefPtr<4> NVar13;
  size_t sVar14;
  undefined8 *puVar15;
  unsigned_long *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *current_00;
  NodeRefPtr<4> values [16];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  ThreadLocal2 *local_838;
  ThreadLocal2 *local_830;
  ThreadLocal2 *local_828;
  bool local_820;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  unsigned_long uStack_7e0;
  undefined8 local_7d8;
  unsigned_long uStack_7d0;
  unsigned_long local_7c8;
  ThreadLocal2 *local_7a8;
  bool local_7a0 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_798;
  undefined8 local_788 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_778;
  unsigned_long local_768 [6];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_738 [16];
  
  if ((this->cfg).maxDepth < current->depth) {
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_738[0].depth = (size_t)&local_738[0].prims;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"depth limit reached","");
    *puVar15 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar15 + 1) = 1;
    puVar15[2] = puVar15 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 2),local_738[0].depth,
               (long)&(((CentGeomBBox3fa *)local_738[0].depth)->geomBounds).lower.field_0 +
               CONCAT71(local_738[0]._9_7_,local_738[0].alloc_barrier));
    __cxa_throw(puVar15,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  range = &(current->prims).super_extended_range<unsigned_long>;
  if ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).maxLeafSize) {
    NVar13 = BVHBuilderBinnedFastSpatialSAH::
             CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
             ::operator()((CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
                           *)this->createLeaf,this->prims,&range->super_range<unsigned_long>,alloc);
    return (NodeRefPtr<4>)NVar13.ptr;
  }
  local_738[0].alloc_barrier = current->alloc_barrier;
  local_738[0].depth = current->depth;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0 + 8);
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
       (range->super_range<unsigned_long>)._begin;
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
       (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  local_738[0].prims.super_extended_range<unsigned_long>._ext_end =
       (current->prims).super_extended_range<unsigned_long>._ext_end;
  uVar22 = 1;
  do {
    if (uVar22 == 0) {
      uVar18 = 0xffffffffffffffff;
    }
    else {
      uVar18 = 0xffffffffffffffff;
      puVar16 = &local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _end;
      uVar17 = 0;
      uVar19 = 0;
      do {
        uVar20 = *puVar16 - ((range<unsigned_long> *)(puVar16 + -1))->_begin;
        if (((this->cfg).maxLeafSize < uVar20) && (uVar19 < uVar20)) {
          uVar18 = uVar17;
          uVar19 = uVar20;
        }
        uVar17 = uVar17 + 1;
        puVar16 = puVar16 + 0xe;
      } while (uVar22 != uVar17);
    }
    if (uVar18 == 0xffffffffffffffff) break;
    local_828 = (ThreadLocal2 *)(current->depth + 1);
    local_820 = false;
    local_818._0_8_ = 0x7f8000007f800000;
    local_818._8_8_ = 0x7f8000007f800000;
    local_808 = 0xff800000ff800000;
    uStack_800 = 0xff800000ff800000;
    local_7f8 = 0x7f8000007f800000;
    uStack_7f0 = 0x7f8000007f800000;
    local_7e8 = 0xff800000ff800000;
    uStack_7e0 = 0xff800000ff800000;
    local_7c8 = 0;
    local_7d8 = 0;
    uStack_7d0 = 0;
    local_7a0[0] = false;
    local_798._0_8_ = 0x7f8000007f800000;
    local_798._8_8_ = 0x7f8000007f800000;
    local_788[0] = 0xff800000ff800000;
    local_788[1] = 0xff800000ff800000;
    local_778._0_8_ = 0x7f8000007f800000;
    local_778._8_8_ = 0x7f8000007f800000;
    local_768[0] = 0xff800000ff800000;
    local_768[1] = 0xff800000ff800000;
    local_768[4] = 0;
    local_768[2] = 0;
    local_768[3] = 0;
    local_7a8 = local_828;
    HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    splitFallback(this->heuristic,&local_738[uVar18].prims,(PrimInfoExtRange *)&local_818.field_1,
                  (PrimInfoExtRange *)&local_798.field_1);
    lVar11 = uVar22 * 0x70;
    local_738[uVar18].alloc_barrier = local_7a0[lVar11];
    local_738[uVar18].depth = *(size_t *)(local_7a0 + lVar11 + -8);
    uVar9 = *(undefined8 *)((long)&local_798 + lVar11 + 8);
    *(undefined8 *)&local_738[uVar18].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         *(undefined8 *)(&local_798 + uVar22 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar18].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) = uVar9;
    uVar9 = local_788[uVar22 * 0xe + 1];
    *(undefined8 *)&local_738[uVar18].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         local_788[uVar22 * 0xe];
    *(undefined8 *)
     ((long)&local_738[uVar18].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) = uVar9;
    uVar9 = *(undefined8 *)((long)&local_778 + lVar11 + 8);
    *(undefined8 *)&local_738[uVar18].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         *(undefined8 *)(&local_778 + uVar22 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar18].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) = uVar9;
    uVar10 = local_768[uVar22 * 0xe + 1];
    *(undefined8 *)&local_738[uVar18].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         *(undefined8 *)
          &((Vec3fa *)((long)&local_738[uVar22 - 1].prims.super_CentGeomBBox3fa + 0x30))->field_0;
    *(unsigned_long *)
     ((long)&local_738[uVar18].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) = uVar10;
    uVar10 = local_738[uVar22 - 1].prims.super_extended_range<unsigned_long>.
             super_range<unsigned_long>._end;
    local_738[uVar18].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_738[uVar22 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
         _begin;
    local_738[uVar18].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         uVar10;
    local_738[uVar18].prims.super_extended_range<unsigned_long>._ext_end =
         local_738[uVar22 - 1].prims.super_extended_range<unsigned_long>._ext_end;
    *(ThreadLocal2 **)(local_7a0 + lVar11 + -8) = local_828;
    local_7a0[lVar11] = local_820;
    *(undefined8 *)(&local_798 + uVar22 * 7) = local_818._0_8_;
    *(undefined8 *)((long)&local_798 + lVar11 + 8) = local_818._8_8_;
    local_788[uVar22 * 0xe] = local_808;
    local_788[uVar22 * 0xe + 1] = uStack_800;
    *(undefined8 *)(&local_778 + uVar22 * 7) = local_7f8;
    *(undefined8 *)((long)&local_778 + lVar11 + 8) = uStack_7f0;
    *(undefined8 *)
     &((Vec3fa *)((long)&local_738[uVar22 - 1].prims.super_CentGeomBBox3fa + 0x30))->field_0 =
         local_7e8;
    local_768[uVar22 * 0xe + 1] = uStack_7e0;
    local_738[uVar22 - 1].prims.super_extended_range<unsigned_long>._ext_end = local_7c8;
    local_738[uVar22 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
    _begin = local_7d8;
    local_738[uVar22 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
         = uStack_7d0;
    local_738[uVar22].alloc_barrier = local_7a0[0];
    local_738[uVar22].depth = (size_t)local_7a8;
    *(undefined8 *)&local_738[uVar22].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         local_798._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar22].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) =
         local_798._8_8_;
    *(undefined8 *)&local_738[uVar22].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         local_788[0];
    *(undefined8 *)
     ((long)&local_738[uVar22].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) =
         local_788[1];
    *(undefined8 *)&local_738[uVar22].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         local_778._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar22].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) =
         local_778._8_8_;
    *(unsigned_long *)&local_738[uVar22].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         local_768[0];
    *(unsigned_long *)
     ((long)&local_738[uVar22].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) =
         local_768[1];
    local_738[uVar22].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_768[2];
    local_738[uVar22].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         local_768[3];
    local_738[uVar22].prims.super_extended_range<unsigned_long>._ext_end = local_768[4];
    uVar22 = uVar22 + 1;
  } while (uVar22 < (this->cfg).branchingFactor);
  if ((this->cfg).primrefarrayalloc <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::sse2::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<4>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  local_838 = (ThreadLocal2 *)0x80;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_7a0[0] = true;
    local_7a8 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_828 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    local_820 = true;
    local_830 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,&local_830);
    }
    else {
      *__position._M_current = local_830;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_820 == true) {
      MutexSys::unlock(&local_828->mutex);
    }
    if (local_7a0[0] == true) {
      MutexSys::unlock(&local_7a8->mutex);
    }
  }
  (alloc.talloc0)->bytesUsed = (long)&(local_838->mutex).mutex + (alloc.talloc0)->bytesUsed;
  sVar14 = (alloc.talloc0)->cur;
  uVar18 = (ulong)(-(int)sVar14 & 0xf);
  uVar19 = (long)&(local_838->mutex).mutex + uVar18 + sVar14;
  (alloc.talloc0)->cur = uVar19;
  if ((alloc.talloc0)->end < uVar19) {
    (alloc.talloc0)->cur = sVar14;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_838 << 2)) {
      pcVar21 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_838);
    }
    else {
      local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar21 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
      (alloc.talloc0)->ptr = pcVar21;
      sVar14 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar14;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = (size_t)local_828;
      (alloc.talloc0)->cur = (size_t)local_838;
      if (local_828 < local_838) {
        (alloc.talloc0)->cur = 0;
        local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar21 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
        (alloc.talloc0)->ptr = pcVar21;
        sVar14 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar14;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)local_828;
        (alloc.talloc0)->cur = (size_t)local_838;
        if (local_828 < local_838) {
          (alloc.talloc0)->cur = 0;
          pcVar21 = (char *)0x0;
          goto LAB_00d09d63;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar14;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar18;
    pcVar21 = (alloc.talloc0)->ptr + (uVar19 - (long)local_838);
  }
LAB_00d09d63:
  pcVar21[0x60] = '\0';
  pcVar21[0x61] = '\0';
  pcVar21[0x62] = -0x80;
  pcVar21[99] = '\x7f';
  pcVar21[100] = '\0';
  pcVar21[0x65] = '\0';
  pcVar21[0x66] = -0x80;
  pcVar21[0x67] = '\x7f';
  pcVar21[0x68] = '\0';
  pcVar21[0x69] = '\0';
  pcVar21[0x6a] = -0x80;
  pcVar21[0x6b] = '\x7f';
  pcVar21[0x6c] = '\0';
  pcVar21[0x6d] = '\0';
  pcVar21[0x6e] = -0x80;
  pcVar21[0x6f] = '\x7f';
  pcVar21[0x40] = '\0';
  pcVar21[0x41] = '\0';
  pcVar21[0x42] = -0x80;
  pcVar21[0x43] = '\x7f';
  pcVar21[0x44] = '\0';
  pcVar21[0x45] = '\0';
  pcVar21[0x46] = -0x80;
  pcVar21[0x47] = '\x7f';
  pcVar21[0x48] = '\0';
  pcVar21[0x49] = '\0';
  pcVar21[0x4a] = -0x80;
  pcVar21[0x4b] = '\x7f';
  pcVar21[0x4c] = '\0';
  pcVar21[0x4d] = '\0';
  pcVar21[0x4e] = -0x80;
  pcVar21[0x4f] = '\x7f';
  pcVar21[0x20] = '\0';
  pcVar21[0x21] = '\0';
  pcVar21[0x22] = -0x80;
  pcVar21[0x23] = '\x7f';
  pcVar21[0x24] = '\0';
  pcVar21[0x25] = '\0';
  pcVar21[0x26] = -0x80;
  pcVar21[0x27] = '\x7f';
  pcVar21[0x28] = '\0';
  pcVar21[0x29] = '\0';
  pcVar21[0x2a] = -0x80;
  pcVar21[0x2b] = '\x7f';
  pcVar21[0x2c] = '\0';
  pcVar21[0x2d] = '\0';
  pcVar21[0x2e] = -0x80;
  pcVar21[0x2f] = '\x7f';
  pcVar21[0x70] = '\0';
  pcVar21[0x71] = '\0';
  pcVar21[0x72] = -0x80;
  pcVar21[0x73] = -1;
  pcVar21[0x74] = '\0';
  pcVar21[0x75] = '\0';
  pcVar21[0x76] = -0x80;
  pcVar21[0x77] = -1;
  pcVar21[0x78] = '\0';
  pcVar21[0x79] = '\0';
  pcVar21[0x7a] = -0x80;
  pcVar21[0x7b] = -1;
  pcVar21[0x7c] = '\0';
  pcVar21[0x7d] = '\0';
  pcVar21[0x7e] = -0x80;
  pcVar21[0x7f] = -1;
  pcVar21[0x50] = '\0';
  pcVar21[0x51] = '\0';
  pcVar21[0x52] = -0x80;
  pcVar21[0x53] = -1;
  pcVar21[0x54] = '\0';
  pcVar21[0x55] = '\0';
  pcVar21[0x56] = -0x80;
  pcVar21[0x57] = -1;
  pcVar21[0x58] = '\0';
  pcVar21[0x59] = '\0';
  pcVar21[0x5a] = -0x80;
  pcVar21[0x5b] = -1;
  pcVar21[0x5c] = '\0';
  pcVar21[0x5d] = '\0';
  pcVar21[0x5e] = -0x80;
  pcVar21[0x5f] = -1;
  pcVar21[0x30] = '\0';
  pcVar21[0x31] = '\0';
  pcVar21[0x32] = -0x80;
  pcVar21[0x33] = -1;
  pcVar21[0x34] = '\0';
  pcVar21[0x35] = '\0';
  pcVar21[0x36] = -0x80;
  pcVar21[0x37] = -1;
  pcVar21[0x38] = '\0';
  pcVar21[0x39] = '\0';
  pcVar21[0x3a] = -0x80;
  pcVar21[0x3b] = -1;
  pcVar21[0x3c] = '\0';
  pcVar21[0x3d] = '\0';
  pcVar21[0x3e] = -0x80;
  pcVar21[0x3f] = -1;
  lVar11 = 0;
  do {
    pcVar3 = pcVar21 + lVar11 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\b';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    lVar11 = lVar11 + 2;
  } while (lVar11 != 4);
  if (uVar22 != 0) {
    pVVar12 = &local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper;
    uVar18 = 0;
    do {
      fVar4 = (((BBox<embree::Vec3fa> *)(pVVar12 + -1))->lower).field_0.m128[1];
      fVar5 = (((BBox<embree::Vec3fa> *)(pVVar12 + -1))->lower).field_0.m128[2];
      fVar6 = (pVVar12->field_0).m128[0];
      fVar7 = (pVVar12->field_0).m128[1];
      fVar8 = (pVVar12->field_0).m128[2];
      *(float *)(pcVar21 + uVar18 * 4 + 0x20) =
           (((BBox<embree::Vec3fa> *)(pVVar12 + -1))->lower).field_0.m128[0];
      *(float *)(pcVar21 + uVar18 * 4 + 0x40) = fVar4;
      *(float *)(pcVar21 + uVar18 * 4 + 0x60) = fVar5;
      *(float *)(pcVar21 + uVar18 * 4 + 0x30) = fVar6;
      *(float *)(pcVar21 + uVar18 * 4 + 0x50) = fVar7;
      *(float *)(pcVar21 + uVar18 * 4 + 0x70) = fVar8;
      uVar18 = uVar18 + 1;
      pVVar12 = pVVar12 + 7;
    } while (uVar22 != uVar18);
  }
  if (uVar22 != 0) {
    current_00 = local_738;
    uVar18 = 0;
    do {
      NVar13 = createLargeLeaf(this,current_00,alloc);
      (&local_828)[uVar18] = (ThreadLocal2 *)NVar13.ptr;
      uVar18 = uVar18 + 1;
      current_00 = current_00 + 1;
    } while (uVar22 != uVar18);
    uVar18 = 0;
    do {
      *(ThreadLocal2 **)(pcVar21 + uVar18 * 8) = (&local_828)[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar22 != uVar18);
  }
  return (NodeRefPtr<4>)(size_t)pcVar21;
}

Assistant:

const ReductionTy createLargeLeaf(const BuildRecord& current, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (current.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* create leaf for few primitives */
            if (current.prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,current.prims))
              return createLeaf(prims,current.prims,alloc);

            /* fill all children by always splitting the largest one */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            size_t numChildren = 1;
            children[0] = current;
            do {

              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,children[i].prims))
                  continue;

                /* remember child with largest size */
                if (children[i].prims.size() > bestSize) {
                  bestSize = children[i].prims.size();
                  bestChild = i;
                }
              }
              if (bestChild == (size_t)-1) break;

              /*! split best child into left and right child */
              BuildRecord left(current.depth+1);
              BuildRecord right(current.depth+1);
              if (!canCreateLeaf(prims,children[bestChild].prims)) {
                canCreateLeafSplit(prims,children[bestChild].prims,left.prims,right.prims);
              } else {
                heuristic.splitFallback(children[bestChild].prims,left.prims,right.prims);
              }

              /* add new children left and right */
              children[bestChild] = children[numChildren-1];
              children[numChildren-1] = left;
              children[numChildren+0] = right;
              numChildren++;

            } while (numChildren < cfg.branchingFactor);

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* create node */
            auto node = createNode(children,numChildren,alloc);

            /* recurse into each child  and perform reduction */
            for (size_t i=0; i<numChildren; i++)
              values[i] = createLargeLeaf(children[i],alloc);

            /* perform reduction */
            return updateNode(current,children,node,values,numChildren);
          }